

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void Js::DynamicProfileInfo::WriteData<char16_t_const*>(char16 **sz,PAL_FILE *file)

{
  uint32 uVar1;
  size_t sVar2;
  Memory *this;
  undefined4 local_74;
  size_t sStack_70;
  charcount_t len_1;
  size_t cbNeeded;
  undefined8 local_60;
  TrackAllocData local_58;
  uchar *local_30;
  utf8char_t *tempBuffer;
  size_t cbTempBuffer;
  PAL_FILE *pPStack_18;
  charcount_t len;
  PAL_FILE *file_local;
  char16 **sz_local;
  
  pPStack_18 = file;
  file_local = (PAL_FILE *)sz;
  if (*sz == (char16 *)0x0) {
    local_74 = 0;
    PAL_fwrite(&local_74,4,1,file);
  }
  else {
    sVar2 = PAL_wcslen(*sz);
    cbTempBuffer._4_4_ = (uint32)sVar2;
    uVar1 = UInt32Math::Mul<3u>(cbTempBuffer._4_4_);
    tempBuffer = (utf8char_t *)(ulong)uVar1;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&unsigned_char::typeinfo,0,(size_t)tempBuffer,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
               ,0x9f2);
    this = (Memory *)
           Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_58);
    cbNeeded = (size_t)Memory::HeapAllocator::Alloc;
    local_60 = 0;
    local_30 = Memory::AllocateArray<Memory::HeapAllocator,unsigned_char,false>
                         (this,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,(size_t)tempBuffer);
    sStack_70 = utf8::EncodeInto<(utf8::Utf8EncodingKind)0>
                          (local_30,(size_t)tempBuffer,(char16 *)file_local->bsdFilePtr,
                           cbTempBuffer._4_4_);
    PAL_fwrite(&stack0xffffffffffffff90,8,1,pPStack_18);
    PAL_fwrite(local_30,1,sStack_70,pPStack_18);
    Memory::DeleteArray<Memory::HeapAllocator,unsigned_char>
              (&Memory::HeapAllocator::Instance,(ulong)(cbTempBuffer._4_4_ * 3),local_30);
  }
  return;
}

Assistant:

void DynamicProfileInfo::WriteData<char16 const *>(char16 const * const& sz, FILE * file)
    {
        if (sz)
        {
            charcount_t len = static_cast<charcount_t>(wcslen(sz));
            const size_t cbTempBuffer = UInt32Math::Mul<3>(len);
            utf8char_t * tempBuffer = HeapNewArray(utf8char_t, cbTempBuffer);
            const size_t cbNeeded = utf8::EncodeInto<utf8::Utf8EncodingKind::Cesu8>(tempBuffer, cbTempBuffer, sz, len);
            fwrite(&cbNeeded, sizeof(cbNeeded), 1, file);
            fwrite(tempBuffer, sizeof(utf8char_t), cbNeeded, file);
            HeapDeleteArray(len * 3, tempBuffer);
        }
        else
        {
            charcount_t len = 0;
            fwrite(&len, sizeof(len), 1, file);
        }
    }